

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

example * VW::alloc_examples(size_t param_1,size_t count)

{
  ulong in_RSI;
  size_t i;
  example *ec;
  size_t in_stack_000001a8;
  ulong local_28;
  example *local_8;
  
  local_8 = calloc_or_throw<example>(in_stack_000001a8);
  if (local_8 == (example *)0x0) {
    local_8 = (example *)0x0;
  }
  else {
    for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
      local_8[local_28].in_use = true;
      local_8[local_28].super_example_predict.ft_offset = 0;
    }
  }
  return local_8;
}

Assistant:

example* alloc_examples(size_t, size_t count = 1)
{
  example* ec = calloc_or_throw<example>(count);
  if (ec == nullptr)
    return nullptr;
  for (size_t i = 0; i < count; i++)
  {
    ec[i].in_use = true;
    ec[i].ft_offset = 0;
    //  std::cerr << "  alloc_example.indices.begin()=" << ec->indices.begin() << " end=" << ec->indices.end() << " //
    //  ld = " << ec->ld << "\t|| me = " << ec << std::endl;
  }
  return ec;
}